

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_unlink_page(Pager *pPager,Page *pPage)

{
  sxu32 nBucket;
  Page *pPage_local;
  Pager *pPager_local;
  
  if (pPage->pNextCollide != (Page *)0x0) {
    pPage->pNextCollide->pPrevCollide = pPage->pPrevCollide;
  }
  if (pPage->pPrevCollide == (Page *)0x0) {
    pPager->apHash[(uint)pPage->pgno & pPager->nSize - 1] = pPage->pNextCollide;
  }
  else {
    pPage->pPrevCollide->pNextCollide = pPage->pNextCollide;
  }
  if (pPager->pAll == pPage) {
    pPager->pAll = pPager->pAll->pNext;
  }
  if (pPage->pPrev != (Page *)0x0) {
    pPage->pPrev->pNext = pPage->pNext;
  }
  if (pPage->pNext != (Page *)0x0) {
    pPage->pNext->pPrev = pPage->pPrev;
  }
  pPager->nPage = pPager->nPage - 1;
  return 0;
}

Assistant:

static int pager_unlink_page(Pager *pPager,Page *pPage)
{
	if( pPage->pNextCollide ){
		pPage->pNextCollide->pPrevCollide = pPage->pPrevCollide;
	}
	if( pPage->pPrevCollide ){
		pPage->pPrevCollide->pNextCollide = pPage->pNextCollide;
	}else{
		sxu32 nBucket = PAGE_HASH(pPage->pgno) & (pPager->nSize - 1);
		pPager->apHash[nBucket] = pPage->pNextCollide;
	}
	MACRO_LD_REMOVE(pPager->pAll,pPage);
	pPager->nPage--;
	return UNQLITE_OK;
}